

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pBlendTests.cpp
# Opt level: O3

int __thiscall deqp::gles2::Performance::BlendCase::init(BlendCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  int iVar3;
  AttribSpec *this_00;
  Enum<int,_2UL> local_1e8;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [6];
  ios_base local_160 [264];
  Vec4 local_58;
  Vec4 local_48;
  Vec4 local_38;
  
  pTVar2 = ((this->super_ShaderPerformanceCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1d8 + 8);
  local_1d8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"modeRGB: ",9);
  local_1e8.m_value = this->m_modeRGB;
  local_1e8.m_getName = glu::getBlendEquationName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1e8,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  poVar1 = (ostringstream *)(local_1d8 + 8);
  local_1d8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"modeAlpha: ",0xb);
  local_1e8.m_value = this->m_modeAlpha;
  local_1e8.m_getName = glu::getBlendEquationName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1e8,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  poVar1 = (ostringstream *)(local_1d8 + 8);
  local_1d8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"srcRGB: ",8);
  local_1e8.m_value = this->m_srcRGB;
  local_1e8.m_getName = glu::getBlendFactorName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1e8,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  poVar1 = (ostringstream *)(local_1d8 + 8);
  local_1d8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"dstRGB: ",8);
  local_1e8.m_value = this->m_dstRGB;
  local_1e8.m_getName = glu::getBlendFactorName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1e8,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  poVar1 = (ostringstream *)(local_1d8 + 8);
  local_1d8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"srcAlpha: ",10);
  local_1e8.m_value = this->m_srcAlpha;
  local_1e8.m_getName = glu::getBlendFactorName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1e8,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  poVar1 = (ostringstream *)(local_1d8 + 8);
  local_1d8._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"dstAlpha: ",10);
  local_1e8.m_getName = glu::getBlendFactorName;
  local_1e8.m_value = this->m_dstAlpha;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1e8,(ostream *)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_160);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ShaderPerformanceCase).m_vertShaderSource,0,
             (char *)(this->super_ShaderPerformanceCase).m_vertShaderSource._M_string_length,
             0x6617fe);
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_ShaderPerformanceCase).m_fragShaderSource,0,
             (char *)(this->super_ShaderPerformanceCase).m_fragShaderSource._M_string_length,
             0x64edc6);
  local_1e8.m_getName = (GetNameFunc)0x3f00000000000000;
  local_1e8.m_value = 0x3f000000;
  local_1e8._12_4_ = 0x3f800000;
  local_38.m_data[0] = 0.5;
  local_38.m_data[1] = 1.0;
  local_38.m_data[2] = 0.0;
  local_38.m_data[3] = 0.5;
  local_48.m_data[0] = 0.5;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 1.0;
  local_48.m_data[3] = 0.5;
  local_58.m_data[0] = 1.0;
  local_58.m_data[1] = 0.5;
  local_58.m_data[2] = 0.5;
  local_58.m_data[3] = 0.0;
  this_00 = (AttribSpec *)local_1d8;
  deqp::gls::AttribSpec::AttribSpec
            (this_00,"a_color",(Vec4 *)&local_1e8,&local_38,&local_48,&local_58);
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::
  emplace_back<deqp::gls::AttribSpec>(&(this->super_ShaderPerformanceCase).m_attributes,this_00);
  if ((TestLog *)local_1d8._0_8_ != (TestLog *)(local_1d8 + 0x10)) {
    this_00 = (AttribSpec *)(local_1c8[0]._M_allocated_capacity + 1);
    operator_delete((void *)local_1d8._0_8_,(ulong)this_00);
  }
  iVar3 = deqp::gls::ShaderPerformanceCase::init
                    (&this->super_ShaderPerformanceCase,(EVP_PKEY_CTX *)this_00);
  return iVar3;
}

Assistant:

void BlendCase::init (void)
{
	TestLog& log = m_testCtx.getLog();

	log << TestLog::Message << "modeRGB: " << glu::getBlendEquationStr(m_modeRGB) << TestLog::EndMessage;
	log << TestLog::Message << "modeAlpha: " << glu::getBlendEquationStr(m_modeAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "srcRGB: " << glu::getBlendFactorStr(m_srcRGB) << TestLog::EndMessage;
	log << TestLog::Message << "dstRGB: " << glu::getBlendFactorStr(m_dstRGB) << TestLog::EndMessage;
	log << TestLog::Message << "srcAlpha: " << glu::getBlendFactorStr(m_srcAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "dstAlpha: " << glu::getBlendFactorStr(m_dstAlpha) << TestLog::EndMessage;

	m_vertShaderSource =
		"attribute highp vec4 a_position;\n"
		"attribute mediump vec4 a_color;\n"
		"varying mediump vec4 v_color;\n"
		"void main (void)\n"
		"{\n"
		"	gl_Position = a_position;\n"
		"	v_color = a_color;\n"
		"}\n";
	m_fragShaderSource =
		"varying mediump vec4 v_color;\n"
		"void main (void)\n"
		"{\n"
		"	gl_FragColor = v_color;\n"
		"}\n";

	m_attributes.push_back(AttribSpec("a_color", Vec4(0.0f, 0.5f, 0.5f, 1.0f),
												 Vec4(0.5f, 1.0f, 0.0f, 0.5f),
												 Vec4(0.5f, 0.0f, 1.0f, 0.5f),
												 Vec4(1.0f, 0.5f, 0.5f, 0.0f)));

	ShaderPerformanceCase::init();
}